

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall
icu_63::Locale::getKeywordValue
          (Locale *this,StringPiece keywordName,ByteSink *sink,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined4 extraout_var;
  char *keywordName_00;
  StringPiece s;
  int32_t local_b4;
  int32_t reslen;
  int32_t result_capacity;
  char *buffer;
  int32_t scratch_capacity;
  LocalMemory<char> scratch;
  undefined1 local_70 [8];
  CharString keywordName_nul;
  UErrorCode *status_local;
  ByteSink *sink_local;
  Locale *this_local;
  StringPiece keywordName_local;
  
  keywordName_nul._56_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fIsBogus == '\0') {
      s._12_4_ = 0;
      s.ptr_ = (char *)SUB128(keywordName._0_12_,0);
      s.length_ = SUB124(keywordName._0_12_,8);
      CharString::CharString((CharString *)local_70,s,(UErrorCode *)keywordName_nul._56_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)keywordName_nul._56_8_);
      if (UVar1 == '\0') {
        LocalMemory<char>::LocalMemory((LocalMemory<char> *)&stack0xffffffffffffff60,(char *)0x0);
        buffer._4_4_ = 0x10;
        while (pcVar4 = LocalMemory<char>::allocateInsteadAndReset
                                  ((LocalMemory<char> *)&stack0xffffffffffffff60,buffer._4_4_),
              uVar3 = buffer._4_4_, pcVar4 != (char *)0x0) {
          pcVar4 = LocalPointerBase<char>::getAlias
                             ((LocalPointerBase<char> *)&stack0xffffffffffffff60);
          iVar2 = (*sink->_vptr_ByteSink[3])
                            (sink,(ulong)uVar3,(ulong)uVar3,pcVar4,(ulong)buffer._4_4_,&local_b4);
          _reslen = (char *)CONCAT44(extraout_var,iVar2);
          pcVar4 = this->fullName;
          keywordName_00 = CharString::data((CharString *)local_70);
          uVar3 = uloc_getKeywordValue_63
                            (pcVar4,keywordName_00,_reslen,local_b4,
                             (UErrorCode *)keywordName_nul._56_8_);
          if (*(int *)keywordName_nul._56_8_ != 0xf) {
            UVar1 = ::U_FAILURE(*(UErrorCode *)keywordName_nul._56_8_);
            if (UVar1 == '\0') {
              (*sink->_vptr_ByteSink[2])(sink,_reslen,(ulong)uVar3);
              if (*(int *)keywordName_nul._56_8_ == -0x7c) {
                *(undefined4 *)keywordName_nul._56_8_ = 0;
              }
              scratch.super_LocalPointerBase<char>.ptr._0_4_ = 0;
            }
            else {
              scratch.super_LocalPointerBase<char>.ptr._0_4_ = 1;
            }
            goto LAB_00196739;
          }
          *(undefined4 *)keywordName_nul._56_8_ = 0;
          buffer._4_4_ = uVar3;
        }
        *(undefined4 *)keywordName_nul._56_8_ = 7;
        scratch.super_LocalPointerBase<char>.ptr._0_4_ = 1;
LAB_00196739:
        LocalMemory<char>::~LocalMemory((LocalMemory<char> *)&stack0xffffffffffffff60);
      }
      else {
        scratch.super_LocalPointerBase<char>.ptr._0_4_ = 1;
      }
      CharString::~CharString((CharString *)local_70);
    }
    else {
      *(undefined4 *)keywordName_nul._56_8_ = 1;
    }
  }
  return;
}

Assistant:

void
Locale::getKeywordValue(StringPiece keywordName, ByteSink& sink, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }

    if (fIsBogus) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    if (U_FAILURE(status)) {
        return;
    }

    LocalMemory<char> scratch;
    int32_t scratch_capacity = 16;  // Arbitrarily chosen default size.

    char* buffer;
    int32_t result_capacity, reslen;

    for (;;) {
        if (scratch.allocateInsteadAndReset(scratch_capacity) == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }

        buffer = sink.GetAppendBuffer(
                /*min_capacity=*/scratch_capacity,
                /*desired_capacity_hint=*/scratch_capacity,
                scratch.getAlias(),
                scratch_capacity,
                &result_capacity);

        reslen = uloc_getKeywordValue(
                fullName,
                keywordName_nul.data(),
                buffer,
                result_capacity,
                &status);

        if (status != U_BUFFER_OVERFLOW_ERROR) {
            break;
        }

        scratch_capacity = reslen;
        status = U_ZERO_ERROR;
    }

    if (U_FAILURE(status)) {
        return;
    }

    sink.Append(buffer, reslen);
    if (status == U_STRING_NOT_TERMINATED_WARNING) {
        status = U_ZERO_ERROR;  // Terminators not used.
    }
}